

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__fill_active_edges_new
               (float *scanline,float *scanline_fill,int len,stbtt__active_edge *e,float y_top)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  float y1_00;
  float fVar4;
  float fVar5;
  float x1_00;
  float y1_01;
  float y1_02;
  float fVar6;
  float y2;
  float y1;
  float y3;
  float x3;
  float x2_1;
  float x1_1;
  float y0;
  int x_2;
  float t;
  float area;
  float sign;
  float step;
  float y_crossing;
  int x2;
  int x1;
  int x_1;
  int x;
  float height;
  float dy;
  float sy1;
  float sy0;
  float x_bottom;
  float x_top;
  float xb;
  float dx;
  float x0_1;
  float x0;
  float y_bottom;
  float y_top_local;
  stbtt__active_edge *e_local;
  int len_local;
  float *scanline_fill_local;
  float *scanline_local;
  
  y1_00 = y_top + 1.0;
  _y_bottom = e;
  while( true ) {
    if (_y_bottom == (stbtt__active_edge *)0x0) {
      return;
    }
    if (_y_bottom->ey < y_top) break;
    if ((_y_bottom->fdx != 0.0) || (NAN(_y_bottom->fdx))) {
      xb = _y_bottom->fx;
      fVar6 = _y_bottom->fdx;
      fVar4 = xb + fVar6;
      x = (int)_y_bottom->fdy;
      bVar1 = false;
      if (_y_bottom->sy <= y1_00) {
        bVar1 = y_top <= _y_bottom->ey;
      }
      if (!bVar1) {
        __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                      ,3000,
                      "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                     );
      }
      dy = y_top;
      sy0 = xb;
      if (y_top < _y_bottom->sy) {
        dy = _y_bottom->sy;
        sy0 = fVar6 * (_y_bottom->sy - y_top) + xb;
      }
      height = y1_00;
      sy1 = fVar4;
      if (_y_bottom->ey < y1_00) {
        height = _y_bottom->ey;
        sy1 = fVar6 * (_y_bottom->ey - y_top) + xb;
      }
      fVar5 = sy1;
      if ((((sy0 < 0.0) || (sy1 < 0.0)) || ((float)len <= sy0)) || ((float)len <= sy1)) {
        for (x1_1 = 0.0; (int)x1_1 < len; x1_1 = (float)((int)x1_1 + 1)) {
          fVar5 = (float)(int)x1_1;
          x1_00 = (float)((int)x1_1 + 1);
          y1_01 = ((float)(int)x1_1 - xb) / fVar6 + y_top;
          y1_02 = ((float)((int)x1_1 + 1) - xb) / fVar6 + y_top;
          if ((fVar5 <= xb) || (fVar4 <= x1_00)) {
            if ((fVar5 <= fVar4) || (xb <= x1_00)) {
              if ((fVar5 <= xb) || (fVar4 <= fVar5)) {
                if ((fVar5 <= fVar4) || (xb <= fVar5)) {
                  if ((x1_00 <= xb) || (fVar4 <= x1_00)) {
                    if ((x1_00 <= fVar4) || (xb <= x1_00)) {
                      stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,fVar4,y1_00);
                    }
                    else {
                      stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,x1_00,y1_02);
                      stbtt__handle_clipped_edge
                                (scanline,(int)x1_1,_y_bottom,x1_00,y1_02,fVar4,y1_00);
                    }
                  }
                  else {
                    stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,x1_00,y1_02);
                    stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,x1_00,y1_02,fVar4,y1_00)
                    ;
                  }
                }
                else {
                  stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,fVar5,y1_01);
                  stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,fVar5,y1_01,fVar4,y1_00);
                }
              }
              else {
                stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,fVar5,y1_01);
                stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,fVar5,y1_01,fVar4,y1_00);
              }
            }
            else {
              stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,x1_00,y1_02);
              stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,x1_00,y1_02,fVar5,y1_01);
              stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,fVar5,y1_01,fVar4,y1_00);
            }
          }
          else {
            stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,fVar5,y1_01);
            stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,fVar5,y1_01,x1_00,y1_02);
            stbtt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,x1_00,y1_02,fVar4,y1_00);
          }
        }
      }
      else if ((int)sy0 == (int)sy1) {
        iVar2 = (int)sy0;
        if (iVar2 < 0 || len <= iVar2) {
          __assert_fail("x >= 0 && x < len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                        ,0xbd4,
                        "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                       );
        }
        scanline[iVar2] =
             _y_bottom->direction * (1.0 - ((sy0 - (float)iVar2) + (sy1 - (float)iVar2)) / 2.0) *
             (height - dy) + scanline[iVar2];
        scanline_fill[iVar2] = _y_bottom->direction * (height - dy) + scanline_fill[iVar2];
      }
      else {
        if (sy1 < sy0) {
          fVar6 = dy - y_top;
          dy = y1_00 - (height - y_top);
          sy1 = sy0;
          sy0 = fVar5;
          x = (int)-(float)x;
          height = y1_00 - fVar6;
          xb = fVar4;
        }
        iVar2 = (int)sy0;
        iVar3 = (int)sy1;
        fVar4 = ((float)(iVar2 + 1) - xb) * (float)x + y_top;
        fVar6 = _y_bottom->direction;
        x_2 = (int)(fVar6 * (fVar4 - dy));
        scanline[iVar2] = (float)x_2 * (1.0 - ((sy0 - (float)iVar2) + 1.0) / 2.0) + scanline[iVar2];
        x2 = iVar2;
        while (x2 = x2 + 1, x2 < iVar3) {
          scanline[x2] = (float)x_2 + (fVar6 * (float)x) / 2.0 + scanline[x2];
          x_2 = (int)(fVar6 * (float)x + (float)x_2);
        }
        if (1.01 < ABS((float)x_2)) {
          __assert_fail("fabsf(area) <= 1.01f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                        ,0xbfb,
                        "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                       );
        }
        scanline[iVar3] =
             fVar6 * (1.0 - ((sy1 - (float)iVar3) + 0.0) / 2.0) *
             (height - ((float)x * (float)(iVar3 - (iVar2 + 1)) + fVar4)) + (float)x_2 +
             scanline[iVar3];
        scanline_fill[iVar3] = fVar6 * (height - dy) + scanline_fill[iVar3];
      }
    }
    else {
      fVar6 = _y_bottom->fx;
      if (fVar6 < (float)len) {
        if (fVar6 < 0.0) {
          stbtt__handle_clipped_edge(scanline_fill + -1,0,_y_bottom,fVar6,y_top,fVar6,y1_00);
        }
        else {
          stbtt__handle_clipped_edge(scanline,(int)fVar6,_y_bottom,fVar6,y_top,fVar6,y1_00);
          stbtt__handle_clipped_edge
                    (scanline_fill + -1,(int)fVar6 + 1,_y_bottom,fVar6,y_top,fVar6,y1_00);
        }
      }
    }
    _y_bottom = _y_bottom->next;
  }
  __assert_fail("e->ey >= y_top",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                ,0xba5,
                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
               );
}

Assistant:

static void stbtt__fill_active_edges_new(float *scanline, float *scanline_fill, int len, stbtt__active_edge *e, float y_top)
{
   float y_bottom = y_top+1;

   while (e) {
      // brute force every pixel

      // compute intersection points with top & bottom
      STBTT_assert(e->ey >= y_top);

      if (e->fdx == 0) {
         float x0 = e->fx;
         if (x0 < len) {
            if (x0 >= 0) {
               stbtt__handle_clipped_edge(scanline,(int) x0,e, x0,y_top, x0,y_bottom);
               stbtt__handle_clipped_edge(scanline_fill-1,(int) x0+1,e, x0,y_top, x0,y_bottom);
            } else {
               stbtt__handle_clipped_edge(scanline_fill-1,0,e, x0,y_top, x0,y_bottom);
            }
         }
      } else {
         float x0 = e->fx;
         float dx = e->fdx;
         float xb = x0 + dx;
         float x_top, x_bottom;
         float sy0,sy1;
         float dy = e->fdy;
         STBTT_assert(e->sy <= y_bottom && e->ey >= y_top);

         // compute endpoints of line segment clipped to this scanline (if the
         // line segment starts on this scanline. x0 is the intersection of the
         // line with y_top, but that may be off the line segment.
         if (e->sy > y_top) {
            x_top = x0 + dx * (e->sy - y_top);
            sy0 = e->sy;
         } else {
            x_top = x0;
            sy0 = y_top;
         }
         if (e->ey < y_bottom) {
            x_bottom = x0 + dx * (e->ey - y_top);
            sy1 = e->ey;
         } else {
            x_bottom = xb;
            sy1 = y_bottom;
         }

         if (x_top >= 0 && x_bottom >= 0 && x_top < len && x_bottom < len) {
            // from here on, we don't have to range check x values

            if ((int) x_top == (int) x_bottom) {
               float height;
               // simple case, only spans one pixel
               int x = (int) x_top;
               height = sy1 - sy0;
               STBTT_assert(x >= 0 && x < len);
               scanline[x] += e->direction * (1-((x_top - x) + (x_bottom-x))/2)  * height;
               scanline_fill[x] += e->direction * height; // everything right of this pixel is filled
            } else {
               int x,x1,x2;
               float y_crossing, step, sign, area;
               // covers 2+ pixels
               if (x_top > x_bottom) {
                  // flip scanline vertically; signed area is the same
                  float t;
                  sy0 = y_bottom - (sy0 - y_top);
                  sy1 = y_bottom - (sy1 - y_top);
                  t = sy0, sy0 = sy1, sy1 = t;
                  t = x_bottom, x_bottom = x_top, x_top = t;
                  dx = -dx;
                  dy = -dy;
                  t = x0, x0 = xb, xb = t;
                  // [DEAR IMGUI] Fix static analyzer warning
                  (void)dx; // [ImGui: fix static analyzer warning]
               }

               x1 = (int) x_top;
               x2 = (int) x_bottom;
               // compute intersection with y axis at x1+1
               y_crossing = (x1+1 - x0) * dy + y_top;

               sign = e->direction;
               // area of the rectangle covered from y0..y_crossing
               area = sign * (y_crossing-sy0);
               // area of the triangle (x_top,y0), (x+1,y0), (x+1,y_crossing)
               scanline[x1] += area * (1-((x_top - x1)+(x1+1-x1))/2);

               step = sign * dy;
               for (x = x1+1; x < x2; ++x) {
                  scanline[x] += area + step/2;
                  area += step;
               }
               y_crossing += dy * (x2 - (x1+1));

               STBTT_assert(STBTT_fabs(area) <= 1.01f);

               scanline[x2] += area + sign * (1-((x2-x2)+(x_bottom-x2))/2) * (sy1-y_crossing);

               scanline_fill[x2] += sign * (sy1-sy0);
            }
         } else {
            // if edge goes outside of box we're drawing, we require
            // clipping logic. since this does not match the intended use
            // of this library, we use a different, very slow brute
            // force implementation
            int x;
            for (x=0; x < len; ++x) {
               // cases:
               //
               // there can be up to two intersections with the pixel. any intersection
               // with left or right edges can be handled by splitting into two (or three)
               // regions. intersections with top & bottom do not necessitate case-wise logic.
               //
               // the old way of doing this found the intersections with the left & right edges,
               // then used some simple logic to produce up to three segments in sorted order
               // from top-to-bottom. however, this had a problem: if an x edge was epsilon
               // across the x border, then the corresponding y position might not be distinct
               // from the other y segment, and it might ignored as an empty segment. to avoid
               // that, we need to explicitly produce segments based on x positions.

               // rename variables to clearly-defined pairs
               float y0 = y_top;
               float x1 = (float) (x);
               float x2 = (float) (x+1);
               float x3 = xb;
               float y3 = y_bottom;

               // x = e->x + e->dx * (y-y_top)
               // (y-y_top) = (x - e->x) / e->dx
               // y = (x - e->x) / e->dx + y_top
               float y1 = (x - x0) / dx + y_top;
               float y2 = (x+1 - x0) / dx + y_top;

               if (x0 < x1 && x3 > x2) {         // three segments descending down-right
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x1,y1);
                  stbtt__handle_clipped_edge(scanline,x,e, x1,y1, x2,y2);
                  stbtt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
               } else if (x3 < x1 && x0 > x2) {  // three segments descending down-left
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x2,y2);
                  stbtt__handle_clipped_edge(scanline,x,e, x2,y2, x1,y1);
                  stbtt__handle_clipped_edge(scanline,x,e, x1,y1, x3,y3);
               } else if (x0 < x1 && x3 > x1) {  // two segments across x, down-right
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x1,y1);
                  stbtt__handle_clipped_edge(scanline,x,e, x1,y1, x3,y3);
               } else if (x3 < x1 && x0 > x1) {  // two segments across x, down-left
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x1,y1);
                  stbtt__handle_clipped_edge(scanline,x,e, x1,y1, x3,y3);
               } else if (x0 < x2 && x3 > x2) {  // two segments across x+1, down-right
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x2,y2);
                  stbtt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
               } else if (x3 < x2 && x0 > x2) {  // two segments across x+1, down-left
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x2,y2);
                  stbtt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
               } else {  // one segment
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x3,y3);
               }
            }
         }
      }
      e = e->next;
   }
}